

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QDockWidgetGroupWindow::restore(QDockWidgetGroupWindow *this)

{
  long lVar1;
  bool bVar2;
  QLayout *pQVar3;
  QDockAreaLayoutInfo *pQVar4;
  long in_RDI;
  long in_FS_OFFSET;
  QDockAreaLayoutInfo *savedState;
  QDockAreaLayoutInfo *in_stack_ffffffffffffff48;
  DockOption other;
  QDockAreaLayoutInfo *in_stack_ffffffffffffff50;
  QFlagsStorageHelper<QMainWindow::DockOption,_4> local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  QDockWidgetGroupWindow *in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffffcf;
  QDockAreaLayoutInfo *in_stack_ffffffffffffffd0;
  QDockAreaLayoutInfo *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QWidget::layout((QWidget *)0x5f20bf);
  pQVar4 = (QDockAreaLayoutInfo *)(pQVar3 + 8);
  bVar2 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x5f20d4);
  if (!bVar2) {
    layoutInfo((QDockWidgetGroupWindow *)0x5f20ec);
    QDockAreaLayoutInfo::operator=(pQVar4,in_stack_ffffffffffffff48);
    QDockAreaLayoutInfo::QDockAreaLayoutInfo(pQVar4);
    QDockAreaLayoutInfo::operator=(pQVar4,in_stack_ffffffffffffff48);
    QDockAreaLayoutInfo::~QDockAreaLayoutInfo(pQVar4);
    in_stack_ffffffffffffff50 = pQVar4;
  }
  QRect::QRect((QRect *)in_stack_ffffffffffffff50);
  *(undefined8 *)(in_RDI + 0x28) = local_88;
  *(undefined8 *)(in_RDI + 0x30) = uStack_80;
  QList<int>::clear((QList<int> *)in_stack_ffffffffffffff50);
  adjustFlags(in_stack_ffffffffffffff90);
  layoutInfo((QDockWidgetGroupWindow *)0x5f2151);
  QDockAreaLayoutInfo::fitItems(in_stack_ffffffffffffffe8);
  pQVar4 = layoutInfo((QDockWidgetGroupWindow *)0x5f2163);
  other = (DockOption)((ulong)pQVar4 >> 0x20);
  QWidget::parentWidget((QWidget *)0x5f2171);
  QMainWindow::dockOptions((QMainWindow *)in_stack_ffffffffffffff50);
  local_8c.super_QFlagsStorage<QMainWindow::DockOption>.i =
       (QFlagsStorage<QMainWindow::DockOption>)
       QFlags<QMainWindow::DockOption>::operator&
                 ((QFlags<QMainWindow::DockOption> *)in_stack_ffffffffffffff50,other);
  ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_8c);
  QDockAreaLayoutInfo::apply(in_stack_ffffffffffffffd0,(bool)in_stack_ffffffffffffffcf);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockWidgetGroupWindow::restore()
{
    QDockAreaLayoutInfo &savedState = static_cast<QDockWidgetGroupLayout *>(layout())->savedState;
    if (!savedState.isEmpty()) {
        *layoutInfo() = savedState;
        savedState = QDockAreaLayoutInfo();
    }
    currentGapRect = QRect();
    currentGapPos.clear();
    adjustFlags();
    layoutInfo()->fitItems();
    layoutInfo()->apply(static_cast<QMainWindow *>(parentWidget())->dockOptions()
                        & QMainWindow::AnimatedDocks);
}